

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O1

bool __thiscall Rml::ElementFormControlTextArea::GetWordWrap(ElementFormControlTextArea *this)

{
  int iVar1;
  String attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  String local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"wrap","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  Element::GetAttribute<std::__cxx11::string>(&local_38,(Element *)this,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return iVar1 != 0;
}

Assistant:

bool ElementFormControlTextArea::GetWordWrap()
{
	String attribute = GetAttribute<String>("wrap", "");
	return attribute != "nowrap";
}